

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int GetRawExpressScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,uchar *esdataresponse,int nb_bytes_response)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int local_498;
  int nbBytesDiscarded;
  uchar *local_490;
  uchar *ptr;
  CHRONO chrono;
  uchar recvbuf [1024];
  
  nbBytesDiscarded = 0;
  ptr = (uchar *)0x0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x400);
  local_498 = nb_bytes_response;
  iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,recvbuf,nb_bytes_response);
  if (iVar1 == 0) {
    iVar1 = nb_bytes_response;
    local_490 = esdataresponse;
    do {
      iVar2 = FindExpressScanDataResponseRPLIDAR
                        (recvbuf,iVar1,nb_bytes_response,&local_498,&ptr,&nbBytesDiscarded);
      if (iVar2 == 1) {
        local_498 = nb_bytes_response;
        if (nbBytesDiscarded < nb_bytes_response) {
          local_498 = nbBytesDiscarded;
        }
      }
      else if (iVar2 == 0) {
        if (0 < iVar1 - (nbBytesDiscarded + nb_bytes_response)) {
          puts("Warning getting data from a RPLIDAR : Unexpected data after a data response. ");
        }
        memcpy(local_490,recvbuf,(long)nb_bytes_response);
        return 0;
      }
      iVar2 = local_498;
      iVar1 = iVar1 - nbBytesDiscarded;
      memmove(recvbuf,recvbuf + nbBytesDiscarded,(long)iVar1);
      if (0x3ff < iVar2 + iVar1) {
        puts("Error reading data from a RPLIDAR : Invalid data. ");
        return 4;
      }
      iVar2 = ReadAllRS232Port(&pRPLIDAR->RS232Port,recvbuf + iVar1,iVar2);
      if (iVar2 != 0) goto LAB_00124b54;
      iVar1 = iVar1 + local_498;
      dVar3 = GetTimeElapsedChronoQuick(&chrono);
    } while (dVar3 <= 4.0);
    puts("Error reading data from a RPLIDAR : Data response timeout. ");
    iVar1 = 2;
  }
  else {
LAB_00124b54:
    puts("Error reading data from a RPLIDAR. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetRawExpressScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, unsigned char* esdataresponse, int nb_bytes_response)
{
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired data response...

	nbBytesToRequest = nb_bytes_response;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;

	for (;;)
	{
		res = FindExpressScanDataResponseRPLIDAR(recvbuf, BytesReceived, nb_bytes_response, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(nb_bytes_response, nbBytesDiscarded);
		}
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Data response timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-nb_bytes_response > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
	}

	// Store the data...
	memcpy(esdataresponse, recvbuf, nb_bytes_response);

	return EXIT_SUCCESS;
}